

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O2

ByteData * __thiscall
cfd::core::Deserializer::ReadVariableData(ByteData *__return_storage_ptr__,Deserializer *this)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_28;
  
  ReadVariableBuffer((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_28,this);
  ByteData::ByteData(__return_storage_ptr__,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_28);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_28);
  return __return_storage_ptr__;
}

Assistant:

ByteData Deserializer::ReadVariableData() {
  return ByteData(ReadVariableBuffer());
}